

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAttributes.cpp
# Opt level: O2

void print_type<int>(TypedAttribute<int> *object)

{
  char *pcVar1;
  ostream *poVar2;
  
  pcVar1 = (char *)(**(code **)(*(long *)object + 0x10))();
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
print_type (const OPENEXR_IMF_NAMESPACE::TypedAttribute<T>& object)
{
    cout << object.typeName () << endl;
}